

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O2

void p_crypto_hash_sha2_512_finish(PHashSHA2_512 *ctx)

{
  puint64 pVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  pVar1 = ctx->len_high;
  uVar2 = ctx->len_low;
  uVar5 = (uint)uVar2 & 0x7f;
  uVar3 = (uint)(0x6f < uVar5) << 7 | 0x70;
  uVar4 = uVar3 - uVar5;
  if (uVar4 != 0 && uVar5 <= uVar3) {
    p_crypto_hash_sha2_512_update(ctx,pp_crypto_hash_sha2_512_pad,(ulong)uVar4);
  }
  (ctx->buf).buf_w[0xe] = pVar1 << 3 | uVar2 >> 0x3d;
  (ctx->buf).buf_w[0xf] = uVar2 << 3;
  pp_crypto_hash_sha2_512_swap_bytes((puint64 *)ctx,0xe);
  pp_crypto_hash_sha2_512_process(ctx,(puint64 *)ctx);
  pp_crypto_hash_sha2_512_swap_bytes(ctx->hash,(uint)(ctx->is384 == 0) * 2 + 6);
  return;
}

Assistant:

void
p_crypto_hash_sha2_512_finish (PHashSHA2_512 *ctx)
{
	puint64	high;
	puint64	low;
	pint	left;
	pint	last;

	left = (pint) (ctx->len_low & 0x7F);
	last = (left < 112) ? (112 - left) : (240 - left);

	low = ctx->len_low << 3;
	high = ctx->len_high << 3
	     | ctx->len_low >> 61;

	if (last > 0)
		p_crypto_hash_sha2_512_update (ctx, pp_crypto_hash_sha2_512_pad, (psize) last);

	ctx->buf.buf_w[14] = high;
	ctx->buf.buf_w[15] = low;

	pp_crypto_hash_sha2_512_swap_bytes (ctx->buf.buf_w, 14);
	pp_crypto_hash_sha2_512_process (ctx, ctx->buf.buf_w);

	pp_crypto_hash_sha2_512_swap_bytes (ctx->hash, ctx->is384 == FALSE ? 8 : 6);
}